

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O2

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeLinear>::TPZCompElHDiv
          (TPZCompElHDiv<pzshape::TPZShapeLinear> *this,TPZCompMesh *mesh,
          TPZCompElHDiv<pzshape::TPZShapeLinear> *copy,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcConMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  int iVar1;
  iterator iVar2;
  mapped_type_conflict *pmVar3;
  ostream *poVar4;
  long lVar5;
  char *local_1d8 [4];
  stringstream sout;
  ostream local_1a8 [376];
  
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_01731238;
  TPZIntelGen<pzshape::TPZShapeLinear>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapeLinear>,&PTR_PTR_0172ec08,mesh,
             &copy->super_TPZIntelGen<pzshape::TPZShapeLinear>,gl2lcConMap,gl2lcElMap);
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElHDiv_0172e830;
  TPZManVector<int,_2>::TPZManVector(&this->fSideOrient,&copy->fSideOrient);
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->fRestraints;
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->fRestraints;
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node._M_size = 0;
  _sout = -1;
  TPZManVector<long,_3>::TPZManVector(&this->fConnectIndexes,3,(long *)&sout);
  this->fhdivfam = copy->fhdivfam;
  (this->super_TPZIntelGen<pzshape::TPZShapeLinear>).super_TPZInterpolatedElement.
  super_TPZInterpolationSpace.fPreferredOrder =
       (copy->super_TPZIntelGen<pzshape::TPZShapeLinear>).super_TPZInterpolatedElement.
       super_TPZInterpolationSpace.fPreferredOrder;
  lVar5 = 0;
  while( true ) {
    iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x90))(this);
    if (iVar1 <= lVar5) {
      return;
    }
    iVar1 = (int)(copy->fConnectIndexes).super_TPZVec<long>.fStore[lVar5];
    _sout = (long)iVar1;
    iVar2 = std::
            _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
            ::find(&gl2lcConMap->_M_t,(key_type_conflict1 *)&sout);
    if ((_Rb_tree_header *)iVar2._M_node == &(gl2lcConMap->_M_t)._M_impl.super__Rb_tree_header)
    break;
    _sout = (long)iVar1;
    pmVar3 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
             operator[](gl2lcConMap,(key_type_conflict1 *)&sout);
    (this->fConnectIndexes).super_TPZVec<long>.fStore[lVar5] = (long)(int)*pmVar3;
    lVar5 = lVar5 + 1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&sout);
  poVar4 = std::operator<<(local_1a8,"ERROR in : ");
  poVar4 = std::operator<<(poVar4,
                           "TPZCompElHDiv<pzshape::TPZShapeLinear>::TPZCompElHDiv(TPZCompMesh &, const TPZCompElHDiv<TSHAPE> &, std::map<int64_t, int64_t> &, std::map<int64_t, int64_t> &) [TSHAPE = pzshape::TPZShapeLinear]"
                          );
  poVar4 = std::operator<<(poVar4," trying to clone the connect index: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  std::operator<<(poVar4," wich is not in mapped connect indexes!");
  std::__cxx11::stringbuf::str();
  poVar4 = std::operator<<((ostream *)&std::cout,local_1d8[0]);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)local_1d8);
  (this->fConnectIndexes).super_TPZVec<long>.fStore[lVar5] = -1;
  std::__cxx11::stringstream::~stringstream((stringstream *)&sout);
  return;
}

Assistant:

TPZCompElHDiv<TSHAPE>::TPZCompElHDiv(TPZCompMesh &mesh,
									 const TPZCompElHDiv<TSHAPE> &copy,
									 std::map<int64_t,int64_t> & gl2lcConMap,
									 std::map<int64_t,int64_t> & gl2lcElMap) :
TPZRegisterClassId(&TPZCompElHDiv::ClassId),
TPZIntelGen<TSHAPE>(mesh,copy,gl2lcConMap,gl2lcElMap), fSideOrient(copy.fSideOrient), fhdivfam(copy.fhdivfam)
{
	this-> fPreferredOrder = copy.fPreferredOrder;
	int i;
	for(i=0;i<NConnects();i++)
	{
		int lcIdx = -1;
		int glIdx = copy.fConnectIndexes[i];
		if (gl2lcConMap.find(glIdx) != gl2lcConMap.end()) lcIdx = gl2lcConMap[glIdx];
		else
		{
			std::stringstream sout;
			sout << "ERROR in : " << __PRETTY_FUNCTION__
			<< " trying to clone the connect index: " << glIdx
			<< " wich is not in mapped connect indexes!";
			LOGPZ_ERROR(logger, sout.str().c_str());
			this-> fConnectIndexes[i] = -1;
			return;
		}
		this-> fConnectIndexes[i] = lcIdx;
	}
}